

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentThread.cpp
# Opt level: O2

string * __thiscall
sznet::CurrentThread::stackTrace_abi_cxx11_
          (string *__return_storage_ptr__,CurrentThread *this,bool demangle)

{
  char cVar1;
  int iVar2;
  void *__ptr;
  char *pcVar3;
  void *pvVar4;
  undefined7 in_register_00000011;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  undefined4 uVar9;
  long lVar10;
  undefined1 local_698 [8];
  void *frame [200];
  size_t len;
  void *local_40;
  int local_38;
  undefined4 local_34;
  int status;
  
  local_34 = SUB84(this,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2 = backtrace(local_698,200,CONCAT71(in_register_00000011,demangle));
  __ptr = (void *)backtrace_symbols(local_698,iVar2);
  if (__ptr != (void *)0x0) {
    frame[199] = (void *)0x100;
    if ((char)local_34 == '\0') {
      local_40 = (void *)0x0;
    }
    else {
      local_40 = malloc(0x100);
    }
    uVar9 = local_34;
    for (lVar10 = 1; lVar10 < iVar2; lVar10 = lVar10 + 1) {
      if ((char)uVar9 == '\0') {
LAB_00112fdb:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        pcVar5 = (char *)0x0;
        pcVar7 = (char *)0x0;
        for (pcVar3 = *(char **)((long)__ptr + lVar10 * 8);
            ((cVar1 = *pcVar3, pcVar6 = pcVar3, pcVar8 = pcVar7, cVar1 == '(' ||
             (pcVar6 = pcVar5, pcVar8 = pcVar3, cVar1 == '+')) || (pcVar8 = pcVar7, cVar1 != '\0'));
            pcVar3 = pcVar3 + 1) {
          pcVar5 = pcVar6;
          pcVar7 = pcVar8;
        }
        if (pcVar5 == (char *)0x0 || pcVar7 == (char *)0x0) goto LAB_00112fdb;
        *pcVar7 = '\0';
        local_38 = 0;
        pvVar4 = (void *)__cxa_demangle(pcVar5 + 1,local_40,frame + 199,&local_38);
        *pcVar7 = '+';
        uVar9 = local_34;
        if (local_38 != 0) goto LAB_00112fdb;
        std::__cxx11::string::append<char*,void>
                  ((string *)__return_storage_ptr__,*(char **)((long)__ptr + lVar10 * 8),pcVar5 + 1)
        ;
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar9 = local_34;
        local_40 = pvVar4;
      }
    }
    free(local_40);
    free(__ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

string stackTrace(bool demangle)
{
	string stack;
	const int max_frames = 200;
	void* frame[max_frames];
	// 该函数用于获取当前线程的调用堆栈,获取的信息将会被存放在buffer中,它是一个指针列表
	int nptrs = ::backtrace(frame, max_frames);
	// backtrace_symbols将从backtrace函数获取的信息转化为一个字符串数组
	char** strings = ::backtrace_symbols(frame, nptrs);
	if (strings)
	{
		size_t len = 256;
		char* demangled = demangle ? static_cast<char*>(::malloc(len)) : nullptr;
		for (int i = 1; i < nptrs; ++i)  // skipping the 0-th, which is this function
		{
			if (demangle)
			{
				// https://panthema.net/2008/0901-stacktrace-demangled/
				// bin/exception_test(_ZN3Bar4testEv+0x79) [0x401909]
				char* left_par = nullptr;
				char* plus = nullptr;
				for (char* p = strings[i]; *p; ++p)
				{
					if (*p == '(')
						left_par = p;
					else if (*p == '+')
						plus = p;
				}

				if (left_par && plus)
				{
					*plus = '\0';
					int status = 0;
					char* ret = abi::__cxa_demangle(left_par + 1, demangled, &len, &status);
					*plus = '+';
					if (status == 0)
					{
						demangled = ret;  // ret could be realloc()
						stack.append(strings[i], left_par + 1);
						stack.append(demangled);
						stack.append(plus);
						stack.push_back('\n');
						continue;
					}
				}
			}
			// Fallback to mangled names
			stack.append(strings[i]);
			stack.push_back('\n');
		}
		free(demangled);
		free(strings);
	}
	return stack;
}